

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob_config.cc
# Opt level: O1

shared_ptr<QPDFJob::PagesConfig> __thiscall QPDFJob::Config::pages(Config *this)

{
  element_type *peVar1;
  QPDFJob *__p;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  element_type *in_RSI;
  shared_ptr<QPDFJob::PagesConfig> sVar2;
  string local_40;
  
  peVar1 = (((QPDFJob *)
            (in_RSI->log).super___shared_ptr<QPDFLogger,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->m).
           super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if ((peVar1->page_specs).super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      *(pointer *)
       ((long)&(peVar1->page_specs).
               super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
               super__Vector_impl_data + 8)) {
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_40,"--pages may only be specified one time","");
    usage(&local_40);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  __p = (QPDFJob *)operator_new(8);
  (__p->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RSI;
  this->o = __p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<QPDFJob::PagesConfig*>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(this + 1),(PagesConfig *)__p);
  sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<QPDFJob::PagesConfig>)
         sVar2.super___shared_ptr<QPDFJob::PagesConfig,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<QPDFJob::PagesConfig>
QPDFJob::Config::pages()
{
    if (!o.m->page_specs.empty()) {
        usage("--pages may only be specified one time");
    }
    return std::shared_ptr<PagesConfig>(new PagesConfig(this));
}